

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O3

int compute_action(lemon *lemp,action *ap)

{
  int iVar1;
  
  iVar1 = -1;
  switch(ap->type) {
  case SHIFT:
    return ((ap->x).stp)->statenum;
  case ACCEPT:
    iVar1 = lemp->nstate + lemp->nrule * 2 + 1;
    break;
  case REDUCE:
    return lemp->nstate + ((ap->x).rp)->iRule + lemp->nrule;
  case ERROR:
    return lemp->nrule * 2 + lemp->nstate;
  case SHIFTREDUCE:
    return lemp->nstate + ((ap->x).rp)->iRule;
  }
  return iVar1;
}

Assistant:

PRIVATE int compute_action(struct lemon *lemp, struct action *ap)
{
  int act;
  switch( ap->type ){
    case SHIFT:  act = ap->x.stp->statenum;                        break;
    case SHIFTREDUCE: act = ap->x.rp->iRule + lemp->nstate;        break;
    case REDUCE: act = ap->x.rp->iRule + lemp->nstate+lemp->nrule; break;
    case ERROR:  act = lemp->nstate + lemp->nrule*2;               break;
    case ACCEPT: act = lemp->nstate + lemp->nrule*2 + 1;           break;
    default:     act = -1; break;
  }
  return act;
}